

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRType_*,_0UL>::resize
          (SmallVector<diligent_spirv_cross::SPIRType_*,_0UL> *this,size_t new_size)

{
  ulong uVar1;
  
  if ((this->super_VectorView<diligent_spirv_cross::SPIRType_*>).buffer_size < new_size) {
    reserve(this,new_size);
    for (uVar1 = (this->super_VectorView<diligent_spirv_cross::SPIRType_*>).buffer_size;
        uVar1 < new_size; uVar1 = uVar1 + 1) {
      (this->super_VectorView<diligent_spirv_cross::SPIRType_*>).ptr[uVar1] = (SPIRType *)0x0;
    }
  }
  (this->super_VectorView<diligent_spirv_cross::SPIRType_*>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}